

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.cpp
# Opt level: O1

void __thiscall embree::BVHN<4>::~BVHN(BVHN<4> *this)

{
  ~BVHN(this);
  alignedFree(this);
  return;
}

Assistant:

BVHN<N>::~BVHN ()
  {
    for (size_t i=0; i<objects.size(); i++) 
      delete objects[i];
  }